

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShaderTextureImageSamplesTests.cpp
# Opt level: O2

IterateResult __thiscall
glcts::ShaderTextureImageSamplesGLSLExtensionEnableTest::iterate
          (ShaderTextureImageSamplesGLSLExtensionEnableTest *this)

{
  bool bVar1;
  TestError *this_00;
  
  bVar1 = ShaderTextureImageSamplesTestBase::buildComputeProgram
                    (&this->super_ShaderTextureImageSamplesTestBase,
                     "#version 440\n\n#extension GL_ARB_shader_texture_image_samples : enable\n\nvoid main()\n{\n#ifndef GL_ARB_shader_texture_image_samples\n    force_compilation_error\n#endif\n}\n"
                     ,false,true);
  if (bVar1) {
    tcu::TestContext::setTestResult
              ((this->super_ShaderTextureImageSamplesTestBase).super_TestCase.super_TestCase.
               super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,"Pass");
    return STOP;
  }
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_00,
             "GL_ARB_shader_image_load_store preprocessor #define is not set to the value of 1",
             (char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cShaderTextureImageSamplesTests.cpp"
             ,0x2aa);
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

tcu::TestNode::IterateResult ShaderTextureImageSamplesGLSLExtensionEnableTest::iterate()
{
	const char* cs_body = "#version 440\n"
						  "\n"
						  "#extension GL_ARB_shader_texture_image_samples : enable\n"
						  "\n"
						  "void main()\n"
						  "{\n"
						  "#ifndef GL_ARB_shader_texture_image_samples\n"
						  "    force_compilation_error\n"
						  "#endif\n"
						  "}\n";

	if (!buildComputeProgram(cs_body, false, /* should_link_po */
							 true))			 /* should_succeed */
	{
		TCU_FAIL("GL_ARB_shader_image_load_store preprocessor #define is not set to the value of 1");
	}

	/* Test case passed */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");

	return STOP;
}